

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

Promise<kj::String> __thiscall
kj::Promise<kj::String>::attach<kj::HttpClient::Response>
          (Promise<kj::String> *this,Response *attachments)

{
  PromiseBase PVar1;
  undefined8 *in_RDX;
  PromiseBase local_58;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_50;
  Response local_48;
  
  local_48._0_8_ = *in_RDX;
  local_48.statusText.content.ptr = (char *)in_RDX[1];
  local_48.statusText.content.size_ = in_RDX[2];
  local_48.headers = (HttpHeaders *)in_RDX[3];
  local_48.body.disposer = (Disposer *)in_RDX[4];
  local_48.body.ptr = (AsyncInputStream *)in_RDX[5];
  in_RDX[5] = 0;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::AttachmentPromiseNode<kj::HttpClient::Response>,kj::_::PromiseDisposer,kj::HttpClient::Response>
            ((PromiseDisposer *)&local_58,(OwnPromiseNode *)attachments,&local_48);
  PVar1.node.ptr = local_58.node.ptr;
  local_58.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
  (this->super_PromiseBase).node.ptr = (PromiseNode *)PVar1.node.ptr;
  local_50.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_50);
  Own<kj::_::AttachmentPromiseNode<kj::HttpClient::Response>,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::AttachmentPromiseNode<kj::HttpClient::Response>,_kj::_::PromiseDisposer> *)
             &local_58);
  Own<kj::AsyncInputStream,_std::nullptr_t>::dispose(&local_48.body);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<T> Promise<T>::attach(Attachments&&... attachments) {
  return Promise(false,
      _::PromiseDisposer::appendPromise<_::AttachmentPromiseNode<Tuple<Attachments...>>>(
          kj::mv(node), kj::tuple(kj::fwd<Attachments>(attachments)...)));
}